

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall
leveldb::log::LogTest_MarginalTrailer_Test::~LogTest_MarginalTrailer_Test
          (LogTest_MarginalTrailer_Test *this)

{
  LogTest_MarginalTrailer_Test *this_local;
  
  ~LogTest_MarginalTrailer_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(LogTest, MarginalTrailer) {
  // Make a trailer that is exactly the same length as an empty record.
  const int n = kBlockSize - 2 * kHeaderSize;
  Write(BigString("foo", n));
  ASSERT_EQ(kBlockSize - kHeaderSize, WrittenBytes());
  Write("");
  Write("bar");
  ASSERT_EQ(BigString("foo", n), Read());
  ASSERT_EQ("", Read());
  ASSERT_EQ("bar", Read());
  ASSERT_EQ("EOF", Read());
}